

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

AssertionResult * __thiscall
Catch::AssertionResult::getTestMacroName_abi_cxx11_(AssertionResult *this)

{
  string *in_RSI;
  AssertionResult *this_local;
  
  std::__cxx11::string::string((string *)this,in_RSI);
  return this;
}

Assistant:

std::string AssertionResult::getTestMacroName() const {
        return m_info.macroName;
    }